

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndDependencyErrors
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this)

{
  bool bVar1;
  StringRefType *rhs;
  CrtAllocator *allocator;
  GenericStringRef<char> local_38;
  undefined1 local_28 [8];
  ValueType error;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  error.data_.o.members = (Member *)this;
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ObjectEmpty
                    (&this->currentError_);
  if (!bVar1) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,kObjectType)
    ;
    rhs = GetErrorsString();
    GenericStringRef<char>::GenericStringRef(&local_38,rhs);
    allocator = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,&local_38,
               &this->currentError_,allocator);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
              (&this->currentError_,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
    AddCurrentError(this,kValidateErrorDependencies,false);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool EndDependencyErrors() {
        if (currentError_.ObjectEmpty())
            return false;
        ValueType error(kObjectType);
        error.AddMember(GetErrorsString(), currentError_, GetStateAllocator());
        currentError_ = error;
        AddCurrentError(kValidateErrorDependencies);
        return true;
    }